

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Train.cpp
# Opt level: O3

float trainCNN(vector<layer_t_*,_std::allocator<layer_t_*>_> *layers,
              vector<case_t,_std::allocator<case_t>_> *cases)

{
  pointer pcVar1;
  ostream *poVar2;
  int iVar3;
  ulong uVar4;
  pointer train_tensor;
  float fVar5;
  float local_34;
  
  train_tensor = (cases->super__Vector_base<case_t,_std::allocator<case_t>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  pcVar1 = (cases->super__Vector_base<case_t,_std::allocator<case_t>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (train_tensor == pcVar1) {
    local_34 = 0.0;
  }
  else {
    local_34 = 0.0;
    uVar4 = 1;
    do {
      iVar3 = (int)uVar4;
      fVar5 = trainIterate(layers,&train_tensor->data,&train_tensor->out);
      local_34 = fVar5 + local_34;
      if (iVar3 == (int)(uVar4 / 6000) * 6000) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Case ",5);
        *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 5;
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,". Err=",6);
        poVar2 = std::ostream::_M_insert<double>((double)(local_34 / (float)iVar3));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
      }
      uVar4 = (ulong)(iVar3 + 1);
      train_tensor = train_tensor + 1;
    } while (train_tensor != pcVar1);
  }
  return local_34;
}

Assistant:

float trainCNN(std::vector<layer_t *> &layers, std::vector<case_t> &cases) {
  float total_error = 0.0f;
  // Iterate over all the test cases
  int count = 0;
  for (case_t &c : cases) {
    // Train the model with a new test case, and retreive the new error.
    float xerr = trainIterate(layers, c.data, c.out);
    // Accumulate the total error for all test cases.
    total_error += xerr;

    // Once every 6000 training iterations, report the total error.
    count++;
    if (count % 6000 == 0) {
      std::cout << "Case " << std::setw(5) << count << ". Err=" << total_error / count << std::endl;
    }
  }
  return total_error;
}